

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O0

string * prettySize_abi_cxx11_(string *__return_storage_ptr__,unsigned_long_long bytes)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  ostringstream local_1a0 [8];
  ostringstream oss;
  int local_24;
  double dStack_20;
  int n;
  double size;
  unsigned_long_long bytes_local;
  
  auVar2._8_4_ = (int)(bytes >> 0x20);
  auVar2._0_8_ = bytes;
  auVar2._12_4_ = 0x45300000;
  local_24 = 0;
  for (dStack_20 = (auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0);
      1024.0 <= dStack_20; dStack_20 = dStack_20 / 1024.0) {
    local_24 = local_24 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,dStack_20);
  std::operator<<(poVar1,units[local_24]);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static inline string prettySize(unsigned long long bytes)
{
    double size = bytes;
    int n = 0;

    while (size >= 1024) {
        size /= 1024;
        n++;
    }

  ostringstream oss;
  oss << size << units[n];

  return oss.str();
}